

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void alphargbblend_generic
               (uint coverage,QRgba64 *dest,int x,QRgba64 *srcLinear,QRgba64 *src,
               QColorTrcLut *colorProfile)

{
  int coverage_00;
  QRgba64 slinear;
  long in_FS_OFFSET;
  QRgba64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (coverage != 0xff000000) {
    if (coverage == 0xffffffff) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        blend_pixel(dest + x,(QRgba64)src->rgba);
        return;
      }
      goto LAB_005bfd1c;
    }
    if ((short)(dest[x].rgba >> 0x30) != -1) {
      coverage_00 = qRgbAvg(coverage);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        alphamapblend_generic(coverage_00,dest,x,srcLinear,src,colorProfile);
        return;
      }
      goto LAB_005bfd1c;
    }
    if (0xfffeffffffffffff < src->rgba) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        rgbBlendPixel(dest + x,coverage,(QRgba64)srcLinear->rgba,colorProfile);
        return;
      }
      goto LAB_005bfd1c;
    }
    local_40.rgba = dest[x].rgba;
    blend_pixel(&local_40,(QRgba64)src->rgba);
    slinear.rgba = local_40.rgba;
    if (colorProfile != (QColorTrcLut *)0x0) {
      slinear = QColorTrcLut::toLinear(colorProfile,local_40);
    }
    rgbBlendPixel(dest + x,coverage,slinear,colorProfile);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005bfd1c:
  __stack_chk_fail();
}

Assistant:

static inline void alphargbblend_generic(uint coverage, QRgba64 *dest, int x, const QRgba64 &srcLinear, const QRgba64 &src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0xff000000) {
        // nothing
    } else if (coverage == 0xffffffff) {
        blend_pixel(dest[x], src);
    } else if (!dest[x].isOpaque()) {
        // Do a gray alphablend.
        alphamapblend_generic(qRgbAvg(coverage), dest, x, srcLinear, src, colorProfile);
    } else if (src.isOpaque()) {
        rgbBlendPixel(dest[x], coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgba64 s = dest[x];
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        if (colorProfile)
            s = colorProfile->toLinear(s);
        rgbBlendPixel(dest[x], coverage, s, colorProfile);
    }
}